

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer.h
# Opt level: O0

void __thiscall
lf::io::VtkWriter::
CheckAttributeSetName<std::vector<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>,std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>>>>
          (VtkWriter *this,
          vector<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_>_>
          *data,string *name)

{
  bool bVar1;
  size_type sVar2;
  LfException *pLVar3;
  allocator<char> local_99;
  string local_98;
  undefined1 local_75;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  __normal_iterator<const_boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_*,_std::vector<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_>_>_>
  local_48;
  string *local_40;
  variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>
  *local_38;
  __normal_iterator<const_boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_*,_std::vector<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_>_>_>
  local_30;
  __normal_iterator<const_boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_*,_std::vector<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_>_>_>
  local_28;
  anon_class_8_1_898f2789_for__M_pred local_20;
  string *name_local;
  vector<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_>_>
  *data_local;
  VtkWriter *this_local;
  
  local_20.name = name;
  name_local = (string *)data;
  data_local = (vector<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_>_>
                *)this;
  local_30._M_current =
       (variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>
        *)std::
          vector<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_>_>
          ::begin(data);
  local_38 = (variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>
              *)std::
                vector<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_>_>
                ::end((vector<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_>_>
                       *)name_local);
  local_40 = local_20.name;
  local_28 = std::
             find_if<__gnu_cxx::__normal_iterator<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>const*,std::vector<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>,std::allocato___oat>,lf::io::VtkFile::VectorData<double>>>>const__std____cxx11__string_const_____lambda_auto_1___1_>
                       (local_30,(__normal_iterator<const_boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_*,_std::vector<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_>_>_>
                                  )local_38,local_20);
  local_48._M_current =
       (variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>
        *)std::
          vector<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_>_>
          ::end((vector<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_>_>
                 *)name_local);
  bVar1 = __gnu_cxx::
          operator==<const_boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_*,_std::vector<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_>_>_>
                    (&local_28,&local_48);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_75 = 1;
    pLVar3 = (LfException *)__cxa_allocate_exception(0x28);
    std::operator+(&local_68,"There is already another Point/Cell Attribute Set with the name ",
                   local_20.name);
    lf::base::LfException::LfException(pLVar3,&local_68);
    local_75 = 0;
    __cxa_throw(pLVar3,&lf::base::LfException::typeinfo,lf::base::LfException::~LfException);
  }
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (local_20.name,' ',0);
  if (sVar2 != 0xffffffffffffffff) {
    pLVar3 = (LfException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"The name of the attribute set cannot contain spaces!",&local_99)
    ;
    lf::base::LfException::LfException(pLVar3,&local_98);
    __cxa_throw(pLVar3,&lf::base::LfException::typeinfo,lf::base::LfException::~LfException);
  }
  return;
}

Assistant:

void VtkWriter::CheckAttributeSetName(const DATA& data,
                                      const std::string& name) {
  if (std::find_if(data.begin(), data.end(), [&](auto& d) {
        return boost::apply_visitor([&](auto&& d2) { return d2.name; }, d) ==
               name;
      }) != data.end()) {
    throw base::LfException(
        "There is already another Point/Cell Attribute Set with the "
        "name " +
        name);
  }
  if (name.find(' ') != std::string::npos) {
    throw base::LfException(
        "The name of the attribute set cannot contain spaces!");
  }
}